

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O3

bool __thiscall
cmTargetCompileDefinitionsCommand::HandleDirectContent
          (cmTargetCompileDefinitionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"COMPILE_DEFINITIONS","");
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x10])
            (local_40,this,content);
  cmTarget::AppendProperty(tgt,&local_60,(char *)local_40[0],false);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmTargetCompileDefinitionsCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                                   bool, bool)
{
  tgt->AppendProperty("COMPILE_DEFINITIONS", this->Join(content).c_str());
  return true;
}